

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O2

void clunk::InitKingMoves(int from)

{
  uint to;
  int iVar1;
  bool bVar2;
  int iVar3;
  ulong map;
  long lVar4;
  int iVar5;
  
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x24c,"void clunk::InitKingMoves(const int)");
  }
  lVar4 = 0;
  iVar5 = 0;
  map = 0;
  do {
    if (lVar4 == 0x20) {
      bVar2 = VerifyMoveMap(from,map);
      if (bVar2) {
        *(ulong *)(&DAT_00165c90 + (ulong)(uint)from * 8) = map;
        return;
      }
      __assert_fail("VerifyMoveMap(from, mvs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x25c,"void clunk::InitKingMoves(const int)");
    }
    iVar1 = *(int *)((long)&DAT_001466e0 + lVar4);
    to = from + iVar1;
    if ((to & 0xffffff88) == 0) {
      iVar3 = Direction(from,to);
      if (iVar3 != iVar1) {
        __assert_fail("Direction(from, to) == dir[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x256,"void clunk::InitKingMoves(const int)");
      }
      if (0x38 < iVar5) {
        __assert_fail("shift <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,599,"void clunk::InitKingMoves(const int)");
      }
      map = map | (ulong)to + 1 << ((byte)iVar5 & 0x3f);
      iVar5 = iVar5 + 8;
    }
    lVar4 = lVar4 + 4;
  } while( true );
}

Assistant:

void InitKingMoves(const int from) {
  assert(IS_SQUARE(from));
  const int dir[8] = {
    SouthWest, South, SouthEast, West,
    East, NorthWest, North, NorthEast
  };
  uint64_t mvs = 0ULL;
  int shift = 0;
  for (int i = 0; i < 8; ++i) {
    const int to = (from + dir[i]);
    if (IS_SQUARE(to)) {
      assert(Direction(from, to) == dir[i]);
      assert(shift <= 56);
      mvs |= (uint64_t(to + 1) << shift);
      shift += 8;
    }
  }
  assert(VerifyMoveMap(from, mvs));
  _queenKing[from + 8] = mvs;
}